

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *ptVar3;
  example *peVar4;
  int i;
  int iVar5;
  long lVar6;
  option_group_definition new_options;
  wclass default_wclass;
  undefined1 *local_990 [2];
  undefined1 local_980 [16];
  string local_970;
  undefined1 *local_950 [2];
  undefined1 local_940 [16];
  string local_930;
  undefined1 *local_910 [2];
  undefined1 local_900 [16];
  string local_8f0;
  undefined1 *local_8d0 [2];
  undefined1 local_8c0 [16];
  string local_8b0;
  undefined1 *local_890 [2];
  undefined1 local_880 [16];
  string local_870;
  option_group_definition local_850;
  undefined1 *local_818 [2];
  undefined1 local_808 [16];
  string local_7f8;
  undefined1 *local_7d8;
  long local_7d0;
  undefined1 local_7c8 [16];
  typed_option<float> local_7b8;
  undefined1 local_710 [112];
  bool local_6a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  typed_option<unsigned_long> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<float> local_350;
  typed_option<bool> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0x70);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  location[3] = 0.0;
  location[4] = 0.0;
  location[5] = 0.0;
  location[6] = 0.0;
  location[7] = 0.0;
  location[8] = 0.0;
  location[9] = 0.0;
  location[10] = 0.0;
  location[0xb] = 0.0;
  location[0xc] = 0.0;
  location[0xd] = 0.0;
  location[0xe] = 0.0;
  location[0xf] = 0.0;
  location[0x10] = 0.0;
  location[0x11] = 0.0;
  location[0x12] = 0.0;
  location[0x13] = 0.0;
  location[0x14] = 0.0;
  location[0x15] = 0.0;
  location[0x16] = 0.0;
  location[0x17] = 0.0;
  location[0x18] = 0.0;
  location[0x19] = 0.0;
  location[0x1a] = 0.0;
  location[0x1b] = 0.0;
  sch->task_data = location;
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"Entity Relation Options","")
  ;
  local_850.m_name._M_dataplus._M_p = (pointer)&local_850.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_850,local_7d8,local_7d8 + local_7d0);
  local_850.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_850.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_850.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8);
  }
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"relation_cost","");
  VW::config::typed_option<float>::typed_option(&local_7b8,&local_870,location + 2);
  local_7b8.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_7b8,1.0);
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"Relation Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_d0,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(&local_850,&local_d0);
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"entity_cost","");
  VW::config::typed_option<float>::typed_option(&local_210,&local_8b0,location + 1);
  local_210.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"Entity Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_170);
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"constraints","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_8f0,(bool *)(location + 4));
  local_6a0 = true;
  local_910[0] = local_900;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"Use Constraints","");
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_710);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_2b0);
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"relation_none_cost","");
  VW::config::typed_option<float>::typed_option(&local_3f0,&local_930,location);
  local_3f0.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_3f0,0.5);
  local_950[0] = local_940;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_950,"None Relation Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_350);
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"skip_cost","");
  VW::config::typed_option<float>::typed_option(&local_530,&local_970,location + 3);
  local_530.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_530,0.01);
  local_990[0] = local_980;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_990,"Skip Cost (only used when search_order = skip","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_490,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_490);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"search_order","");
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_670,&local_7f8,(unsigned_long *)(location + 0x16));
  local_670.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value(&local_670,0);
  local_818[0] = local_808;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_818,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",""
            );
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_5d0,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_5d0);
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cede0;
  if (local_5d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_818[0] != local_808) {
    operator_delete(local_818[0]);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cede0;
  if (local_670.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_990[0] != local_980) {
    operator_delete(local_990[0]);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_950[0] != local_940) {
    operator_delete(local_950[0]);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccf10;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_910[0] != local_900) {
    operator_delete(local_910[0]);
  }
  local_710._0_8_ = &PTR__typed_option_002ccf10;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_890[0] != local_880) {
    operator_delete(local_890[0]);
  }
  local_7b8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cee40;
  if (local_7b8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_850);
  iVar5 = 1;
  do {
    local_7b8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_7b8.super_base_option._vptr_base_option._4_4_,iVar5);
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(location + 6),(uint *)&local_7b8);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 5);
  iVar5 = 5;
  do {
    local_7b8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_7b8.super_base_option._vptr_base_option._4_4_,iVar5);
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(location + 0xe),(uint *)&local_7b8);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0xb);
  *(undefined1 *)((long)location + 0x11) = 0;
  if (*(long *)(location + 0x16) - 3U < 2) {
    peVar4 = VW::alloc_examples(0x20,10);
    local_7b8.super_base_option._vptr_base_option = (_func_int **)0x0;
    local_7b8.super_base_option.m_name._M_dataplus._M_p = (pointer)0x0;
    lVar6 = 0x6828;
    do {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 ((long)(peVar4->super_example_predict).feature_space + lVar6 + -0x20),
                 (wclass *)&local_7b8);
      lVar6 = lVar6 + 0x68d0;
    } while (lVar6 != 0x48048);
    *(example **)(location + 0x18) = peVar4;
    *(example **)(location + 0x1a) = peVar4 + 4;
    Search::search::set_options(sch,Search::IS_LDF);
  }
  else {
    Search::search::set_options(sch,0);
  }
  Search::search::set_num_learners(sch,2);
  if (*(unsigned_long *)(location + 0x16) == 4) {
    Search::search::set_num_learners(sch,3);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_850.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850.m_name._M_dataplus._M_p != &local_850.m_name.field_2) {
    operator_delete(local_850.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}